

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

char * ptls_jsonescape(char *buf,char *unsafe_str,size_t len)

{
  uint8_t uVar1;
  uint8_t *end;
  uint8_t *src;
  char *dst;
  size_t len_local;
  char *unsafe_str_local;
  char *buf_local;
  
  src = (uint8_t *)buf;
  for (end = (uint8_t *)unsafe_str; end != (uint8_t *)(unsafe_str + len); end = end + 1) {
    uVar1 = *end;
    if (uVar1 == '\b') {
      src[0] = '\\';
      src[1] = 'b';
      src = src + 2;
    }
    else if (uVar1 == '\t') {
      src[0] = '\\';
      src[1] = 't';
      src = src + 2;
    }
    else if (uVar1 == '\n') {
      src[0] = '\\';
      src[1] = 'n';
      src = src + 2;
    }
    else if (uVar1 == '\f') {
      src[0] = '\\';
      src[1] = 'f';
      src = src + 2;
    }
    else if (uVar1 == '\r') {
      src[0] = '\\';
      src[1] = 'r';
      src = src + 2;
    }
    else if (uVar1 == '\"') {
      src[0] = '\\';
      src[1] = '\"';
      src = src + 2;
    }
    else if (uVar1 == '/') {
      src[0] = '\\';
      src[1] = '/';
      src = src + 2;
    }
    else if (uVar1 == '\\') {
      src[0] = '\\';
      src[1] = '\\';
      src = src + 2;
    }
    else if ((*end < 0x20) || (*end == '\x7f')) {
      builtin_memcpy(src,"\\u00",4);
      src = (uint8_t *)byte_to_hex((char *)(src + 4),*end);
    }
    else {
      *src = *end;
      src = src + 1;
    }
  }
  *src = '\0';
  return (char *)src;
}

Assistant:

char *ptls_jsonescape(char *buf, const char *unsafe_str, size_t len)
{
    char *dst = buf;
    const uint8_t *src = (const uint8_t *)unsafe_str, *end = src + len;

    for (; src != end; ++src) {
        switch (*src) {
#define MAP(ch, escaped)                                                                                                           \
    case ch:                                                                                                                       \
        memcpy(dst, (escaped), sizeof(escaped) - 1);                                                                               \
        dst += sizeof(escaped) - 1;                                                                                                \
        break
            MAP('"', "\\\"");
            MAP('\\', "\\\\");
            MAP('/', "\\/");
            MAP('\b', "\\b");
            MAP('\f', "\\f");
            MAP('\n', "\\n");
            MAP('\r', "\\r");
            MAP('\t', "\\t");
#undef MAP
        default:
            if (*src < 0x20 || *src == 0x7f) {
                *dst++ = '\\';
                *dst++ = 'u';
                *dst++ = '0';
                *dst++ = '0';
                dst = byte_to_hex(dst, *src);
            } else {
                *dst++ = *src;
            }
            break;
        }
    }
    *dst = '\0';

    return dst;
}